

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feat.c
# Opt level: O3

int feat_free(feat_t *f)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 0;
  if (f != (feat_t *)0x0) {
    iVar1 = f->refcount;
    iVar2 = iVar1 + -1;
    f->refcount = iVar2;
    if (iVar1 < 2) {
      if (f->cepbuf != (mfcc_t **)0x0) {
        ckd_free_2d(f->cepbuf);
      }
      ckd_free(f->tmpcepbuf);
      if (f->name != (char *)0x0) {
        ckd_free(f->name);
      }
      if (f->lda != (mfcc_t ***)0x0) {
        ckd_free_3d(f->lda);
      }
      ckd_free(f->stream_len);
      ckd_free(f->sv_len);
      ckd_free(f->sv_buf);
      subvecs_free(f->subvecs);
      cmn_free(f->cmn_struct);
      agc_free(f->agc_struct);
      ckd_free(f);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int
feat_free(feat_t * f)
{
    if (f == NULL)
        return 0;
    if (--f->refcount > 0)
        return f->refcount;

    if (f->cepbuf)
        ckd_free_2d((void **) f->cepbuf);
    ckd_free(f->tmpcepbuf);

    if (f->name) {
        ckd_free((void *) f->name);
    }
    if (f->lda)
        ckd_free_3d((void ***) f->lda);

    ckd_free(f->stream_len);
    ckd_free(f->sv_len);
    ckd_free(f->sv_buf);
    subvecs_free(f->subvecs);

    cmn_free(f->cmn_struct);
    agc_free(f->agc_struct);

    ckd_free(f);
    return 0;
}